

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void VmJsonDequoteString(SyString *pStr,jx9_value *pWorker)

{
  char cVar1;
  char *pcVar2;
  byte bVar3;
  undefined8 in_RAX;
  int nLen;
  int *zString;
  char *pcVar4;
  char *zString_00;
  char *pcVar5;
  undefined4 uStack_38;
  int c;
  
  zString_00 = pStr->zString;
  pcVar5 = zString_00 + pStr->nByte;
  _uStack_38 = in_RAX;
  jx9_value_string(pWorker,"",0);
  while( true ) {
    nLen = 0;
    pcVar2 = zString_00;
    while ((pcVar4 = pcVar2 + 1, pcVar2 < pcVar5 && (*pcVar2 != '\\'))) {
      nLen = nLen + 1;
      pcVar2 = pcVar4;
    }
    if (zString_00 < pcVar2) {
      jx9_value_string(pWorker,zString_00,nLen);
    }
    if (pcVar5 <= pcVar4) break;
    cVar1 = *pcVar4;
    _uStack_38 = CONCAT44((int)cVar1,uStack_38);
    bVar3 = (byte)(cVar1 + 0x9aU) >> 1 | cVar1 * -0x80;
    zString = &c;
    if ((bVar3 < 8) && ((0xd1U >> (bVar3 & 0x1f) & 1) != 0)) {
      zString = (int *)(&DAT_0013a658 + *(int *)(&DAT_0013a658 + (ulong)bVar3 * 4));
    }
    jx9_value_string(pWorker,(char *)zString,1);
    zString_00 = pcVar2 + 2;
  }
  return;
}

Assistant:

static void VmJsonDequoteString(const SyString *pStr, jx9_value *pWorker)
{
	const char *zIn = pStr->zString;
	const char *zEnd = &pStr->zString[pStr->nByte];
	const char *zCur;
	int c;
	/* Mark the value as a string */
	jx9_value_string(pWorker, "", 0); /* Empty string */
	for(;;){
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '\\' ){
			zIn++;
		}
		if( zIn > zCur ){
			/* Append chunk verbatim */
			jx9_value_string(pWorker, zCur, (int)(zIn-zCur));
		}
		zIn++;
		if( zIn >= zEnd ){
			/* End of the input reached */
			break;
		}
		c = zIn[0];
		/* Unescape the character */
		switch(c){
		case '"':  jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char)); break;
		case '\\': jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char)); break;
		case 'n':  jx9_value_string(pWorker, "\n", (int)sizeof(char)); break;
		case 'r':  jx9_value_string(pWorker, "\r", (int)sizeof(char)); break;
		case 't':  jx9_value_string(pWorker, "\t", (int)sizeof(char)); break;
		case 'f':  jx9_value_string(pWorker, "\f", (int)sizeof(char)); break;
		default:
			jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char));
			break;
		}
		/* Advance the stream cursor */
		zIn++;
	}
}